

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O2

OperatorResultType __thiscall
duckdb::PipelineExecutor::Execute
          (PipelineExecutor *this,DataChunk *input,DataChunk *result,idx_t initial_idx)

{
  size_type __n;
  PhysicalOperator *op;
  idx_t iVar1;
  uint uVar2;
  int operator_idx;
  reference pvVar3;
  optional_ptr<duckdb::DataChunk,_true> chunk;
  DataChunk *pDVar4;
  reference pvVar5;
  type pGVar6;
  reference this_00;
  type pOVar7;
  InterruptException *this_01;
  PhysicalOperator *op_00;
  PhysicalOperator *pPVar8;
  PipelineExecutor *this_02;
  idx_t current_idx;
  idx_t local_78;
  vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
  *local_70;
  PipelineExecutor *local_68;
  DataChunk *local_60;
  DataChunk *local_58;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *local_50;
  vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_true>
  *local_48;
  idx_t local_40;
  PhysicalOperator *local_38;
  
  if (input->count != 0) {
    local_68 = this;
    local_60 = input;
    local_58 = result;
    GoToSource(this,&current_idx,initial_idx);
    if (current_idx == initial_idx) {
      current_idx = initial_idx + 1;
    }
    if (current_idx <=
        (ulong)((long)(local_68->pipeline->operators).
                      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_68->pipeline->operators).
                      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      pPVar8 = (PhysicalOperator *)&local_68->context;
      local_70 = &local_68->intermediate_chunks;
      local_40 = initial_idx + 1;
      local_48 = &local_68->intermediate_states;
      local_50 = &local_68->in_process_operators;
      this_02 = local_68;
      local_78 = initial_idx;
      local_38 = pPVar8;
      do {
        while( true ) {
          iVar1 = current_idx;
          if (((ulong)pPVar8->_vptr_PhysicalOperator[4] & 1) != 0) {
            this_01 = (InterruptException *)__cxa_allocate_exception(0x10);
            InterruptException::InterruptException(this_01);
            __cxa_throw(this_01,&InterruptException::typeinfo,::std::runtime_error::~runtime_error);
          }
          chunk.ptr = local_58;
          if (current_idx <
              (ulong)((long)(this_02->intermediate_chunks).
                            super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_02->intermediate_chunks).
                            super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3)) {
            pvVar3 = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                     ::get<true>(local_70,current_idx);
            chunk.ptr = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                        ::operator*(pvVar3);
          }
          DataChunk::Reset(chunk.ptr);
          if (current_idx == initial_idx) {
            return NEED_MORE_INPUT;
          }
          __n = iVar1 - 1;
          pDVar4 = local_60;
          if (iVar1 != local_40) {
            pvVar3 = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                     ::get<true>(local_70,__n);
            pDVar4 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                     operator*(pvVar3);
          }
          this_02 = local_68;
          pvVar5 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                             (&local_68->pipeline->operators,current_idx - 1);
          op = pvVar5->_M_data;
          StartOperator(this_02,op);
          pGVar6 = unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>,_true>
                   ::operator*(&op->op_state);
          this_00 = vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_true>
                    ::get<true>(local_48,__n);
          pOVar7 = unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>
                   ::operator*(this_00);
          pPVar8 = local_38;
          op_00 = local_38;
          uVar2 = (*op->_vptr_PhysicalOperator[10])(op,local_38,pDVar4,chunk.ptr,pGVar6,pOVar7);
          EndOperator(this_02,op_00,chunk);
          if ((char)uVar2 == '\x01') {
            ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      (&local_50->c,&current_idx);
          }
          else if ((uVar2 & 0xff) == 2) {
            operator_idx = NumericCastImpl<int,_unsigned_long,_false>::Convert(current_idx);
            FinishProcessing(this_02,operator_idx);
            return FINISHED;
          }
          initial_idx = local_78;
          DataChunk::Verify(chunk.ptr);
          if ((chunk.ptr)->count != 0) break;
          if (current_idx == initial_idx) goto LAB_0048605d;
          GoToSource(this_02,&current_idx,initial_idx);
        }
        current_idx = current_idx + 1;
      } while (current_idx <=
               (ulong)((long)(this_02->pipeline->operators).
                             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                             .
                             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_02->pipeline->operators).
                             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                             .
                             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3));
LAB_0048605d:
      return (this_02->in_process_operators).c.
             super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur !=
             (this_02->in_process_operators).c.
             super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    }
    DataChunk::Reference(local_58,local_60);
  }
  return NEED_MORE_INPUT;
}

Assistant:

OperatorResultType PipelineExecutor::Execute(DataChunk &input, DataChunk &result, idx_t initial_idx) {
	if (input.size() == 0) { // LCOV_EXCL_START
		return OperatorResultType::NEED_MORE_INPUT;
	} // LCOV_EXCL_STOP
	D_ASSERT(!pipeline.operators.empty());

	idx_t current_idx;
	GoToSource(current_idx, initial_idx);
	if (current_idx == initial_idx) {
		current_idx++;
	}
	if (current_idx > pipeline.operators.size()) {
		result.Reference(input);
		return OperatorResultType::NEED_MORE_INPUT;
	}
	while (true) {
		if (context.client.interrupted) {
			throw InterruptException();
		}
		// now figure out where to put the chunk
		// if current_idx is the last possible index (>= operators.size()) we write to the result
		// otherwise we write to an intermediate chunk
		auto current_intermediate = current_idx;
		auto &current_chunk =
		    current_intermediate >= intermediate_chunks.size() ? result : *intermediate_chunks[current_intermediate];
		current_chunk.Reset();
		if (current_idx == initial_idx) {
			// we went back to the source: we need more input
			return OperatorResultType::NEED_MORE_INPUT;
		} else {
			auto &prev_chunk =
			    current_intermediate == initial_idx + 1 ? input : *intermediate_chunks[current_intermediate - 1];
			auto operator_idx = current_idx - 1;
			auto &current_operator = pipeline.operators[operator_idx].get();

			// if current_idx > source_idx, we pass the previous operators' output through the Execute of the current
			// operator
			StartOperator(current_operator);
			auto result = current_operator.Execute(context, prev_chunk, current_chunk, *current_operator.op_state,
			                                       *intermediate_states[current_intermediate - 1]);
			EndOperator(current_operator, &current_chunk);
			if (result == OperatorResultType::HAVE_MORE_OUTPUT) {
				// more data remains in this operator
				// push in-process marker
				in_process_operators.push(current_idx);
			} else if (result == OperatorResultType::FINISHED) {
				D_ASSERT(current_chunk.size() == 0);
				FinishProcessing(NumericCast<int32_t>(current_idx));
				return OperatorResultType::FINISHED;
			}
			current_chunk.Verify();
		}

		if (current_chunk.size() == 0) {
			// no output from this operator!
			if (current_idx == initial_idx) {
				// if we got no output from the scan, we are done
				break;
			} else {
				// if we got no output from an intermediate op
				// we go back and try to pull data from the source again
				GoToSource(current_idx, initial_idx);
				continue;
			}
		} else {
			// we got output! continue to the next operator
			current_idx++;
			if (current_idx > pipeline.operators.size()) {
				// if we got output and are at the last operator, we are finished executing for this output chunk
				// return the data and push it into the chunk
				break;
			}
		}
	}
	return in_process_operators.empty() ? OperatorResultType::NEED_MORE_INPUT : OperatorResultType::HAVE_MORE_OUTPUT;
}